

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O1

void __thiscall flow::Value::removeUse(Value *this,Instr *user)

{
  Instr **__src;
  pointer *pppIVar1;
  Instr **ppIVar2;
  __normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
  __dest;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<flow::Instr**,std::vector<flow::Instr*,std::allocator<flow::Instr*>>>,__gnu_cxx::__ops::_Iter_equals_val<flow::Instr*const>>
                     ((this->uses_).
                      super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->uses_).
                      super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  ppIVar2 = (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppIVar2) {
    __src = __dest._M_current + 1;
    if (__src != ppIVar2) {
      memmove(__dest._M_current,__src,(long)ppIVar2 - (long)__src);
    }
    pppIVar1 = &(this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + -1;
    return;
  }
  __assert_fail("i != uses_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/Value.cc"
                ,0x34,"void flow::Value::removeUse(Instr *)");
}

Assistant:

void Value::removeUse(Instr* user) {
  auto i = std::find(uses_.begin(), uses_.end(), user);

  assert(i != uses_.end());

  if (i != uses_.end()) {
    uses_.erase(i);
  }
}